

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_hook_sys_call.cpp
# Opt level: O0

void set_timeouts(int fd,int read_timeout_secs,int write_timeout_secs)

{
  rpchook_t *prVar1;
  rpchook_t *lp;
  int write_timeout_secs_local;
  int read_timeout_secs_local;
  int fd_local;
  
  prVar1 = get_by_fd(fd);
  if (prVar1 != (rpchook_t *)0x0) {
    if (read_timeout_secs != -1) {
      (prVar1->read_timeout).tv_sec = (long)read_timeout_secs;
    }
    if (write_timeout_secs != -1) {
      (prVar1->write_timeout).tv_sec = (long)write_timeout_secs;
    }
  }
  return;
}

Assistant:

void set_timeouts(int fd , int read_timeout_secs, int write_timeout_secs){
	rpchook_t * lp =  get_by_fd( fd );
	if(lp){
		if(read_timeout_secs!=-1)//do not change
			lp->read_timeout.tv_sec = read_timeout_secs;
		if(write_timeout_secs!=-1)
			lp->write_timeout.tv_sec = write_timeout_secs;
	}
}